

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexmetadata.cpp
# Opt level: O2

QString * __thiscall
QHexMetadata::getComment
          (QString *__return_storage_ptr__,QHexMetadata *this,qint64 line,qint64 column)

{
  QHexMetadataLine *pQVar1;
  qint64 qVar2;
  QHexMetadataItem *mi;
  QHexMetadataItem *pQVar3;
  QString *args;
  long lVar4;
  QHexPosition pos;
  QStringList comments;
  QArrayDataPointer<QString> local_68;
  QArrayDataPointer<char16_t> local_48;
  
  qVar2 = column;
  pQVar1 = find(this,line);
  if (pQVar1 == (QHexMetadataLine *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    pos.column = qVar2;
    pos.line = column;
    qVar2 = QHexUtils::positionToOffset((QHexUtils *)this->m_options,(QHexOptions *)line,pos);
    local_68.d = (Data *)0x0;
    local_68.ptr = (QString *)0x0;
    local_68.size = 0;
    pQVar3 = (pQVar1->d).ptr;
    args = &pQVar3->comment;
    for (lVar4 = (pQVar1->d).size * 0x48; lVar4 != 0; lVar4 = lVar4 + -0x48) {
      if (((pQVar3->begin <= qVar2) && (qVar2 <= pQVar3->end)) && ((args->d).size != 0)) {
        QList<QString>::emplaceBack<QString_const&>((QList<QString> *)&local_68,args);
      }
      pQVar3 = pQVar3 + 1;
      args = args + 3;
    }
    QString::QString((QString *)&local_48,"\n");
    QListSpecialMethods<QString>::join
              (__return_storage_ptr__,(QListSpecialMethods<QString> *)&local_68,(QString *)&local_48
              );
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

QString QHexMetadata::getComment(qint64 line, qint64 column) const {
    auto* metadataline = this->find(line);
    if(!metadataline)
        return QString();

    auto offset = QHexUtils::positionToOffset(m_options, {line, column});
    QStringList comments;

    for(auto& mi : *metadataline) {
        if((offset < mi.begin || offset > mi.end) || mi.comment.isEmpty())
            continue;
        comments.push_back(mi.comment);
    }

    return comments.join("\n");
}